

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllTargetsStore::Write<tcu::Vector<unsigned_int,4>>
          (BasicAllTargetsStore *this,GLenum internalformat,Vector<unsigned_int,_4> *write_value,
          Vector<unsigned_int,_4> *expected_value)

{
  CallLogWrapper *this_00;
  _Alloc_hider _Var1;
  BasicAllTargetsStore *this_01;
  GLuint GVar2;
  GLint GVar3;
  ostream *poVar4;
  void *__s;
  long lVar5;
  void *pvVar6;
  Vector<unsigned_int,_4> *pVVar7;
  Vector<unsigned_int,_4> *v;
  Vector<unsigned_int,_4> *v_00;
  Vector<unsigned_int,_4> *v_01;
  Vector<unsigned_int,_4> *v_02;
  Vector<unsigned_int,_4> *v_03;
  Vector<unsigned_int,_4> *v_04;
  Vector<unsigned_int,_4> *v_05;
  Vector<unsigned_int,_4> *v_06;
  int face;
  uint uVar8;
  undefined4 in_register_00000034;
  long lVar9;
  bool bVar10;
  bool bVar11;
  string local_6e0;
  string local_6c0;
  BasicAllTargetsStore *local_6a0;
  GLuint buffer;
  undefined8 local_690;
  long local_688;
  undefined1 local_680;
  char *local_678;
  undefined8 local_670;
  undefined2 local_668;
  undefined6 uStack_666;
  char *local_658;
  undefined8 local_650;
  undefined2 local_648;
  undefined6 uStack_646;
  char *local_638;
  undefined8 local_630;
  undefined2 local_628;
  undefined6 uStack_626;
  char *local_618;
  undefined8 local_610;
  undefined2 local_608;
  undefined6 uStack_606;
  char *local_5f8;
  undefined8 local_5f0;
  undefined2 local_5e8;
  undefined6 uStack_5e6;
  char *local_5d8;
  undefined8 local_5d0;
  undefined2 local_5c8;
  undefined6 uStack_5c6;
  char *local_5b8;
  undefined8 local_5b0;
  undefined2 local_5a8;
  undefined6 uStack_5a6;
  char *local_598;
  undefined8 local_590;
  undefined2 local_588;
  undefined6 uStack_586;
  char *local_578;
  undefined8 local_570;
  undefined2 local_568;
  undefined6 uStack_566;
  char *local_558;
  undefined8 local_550;
  undefined2 local_548;
  undefined6 uStack_546;
  char *local_538;
  undefined8 local_530;
  undefined2 local_528;
  undefined6 uStack_526;
  char *local_518;
  undefined8 local_510;
  undefined2 local_508;
  undefined6 uStack_506;
  char *local_4f8;
  undefined8 local_4f0;
  undefined2 local_4e8;
  undefined6 uStack_4e6;
  char *local_4d8;
  undefined8 local_4d0;
  undefined2 local_4c8;
  undefined6 uStack_4c6;
  long *local_4b8;
  undefined8 local_4b0;
  long local_4a8;
  undefined1 local_4a0;
  char *local_498;
  undefined8 local_490;
  undefined2 local_488;
  undefined6 uStack_486;
  long *local_478;
  undefined8 local_470;
  long local_468;
  undefined1 local_460;
  char *local_458;
  undefined8 local_450;
  undefined2 local_448;
  undefined6 uStack_446;
  long *local_438;
  undefined8 local_430;
  long local_428;
  undefined1 local_420;
  char *local_418;
  undefined8 local_410;
  undefined2 local_408;
  undefined6 uStack_406;
  long *local_3f8;
  undefined8 local_3f0;
  long local_3e8;
  undefined1 local_3e0;
  char *local_3d8;
  undefined8 local_3d0;
  undefined2 local_3c8;
  undefined6 uStack_3c6;
  long *local_3b8;
  undefined8 local_3b0;
  long local_3a8;
  undefined1 local_3a0;
  char *local_398;
  undefined8 local_390;
  undefined2 local_388;
  undefined6 uStack_386;
  long *local_378;
  undefined8 local_370;
  long local_368;
  undefined1 local_360;
  char *local_358;
  undefined8 local_350;
  undefined2 local_348;
  undefined6 uStack_346;
  long *local_338;
  long local_328 [2];
  char *local_318;
  undefined8 local_310;
  undefined2 local_308;
  undefined6 uStack_306;
  char *local_2f8;
  undefined8 local_2f0;
  undefined2 local_2e8;
  undefined6 uStack_2e6;
  char *local_2d8;
  undefined8 local_2d0;
  undefined2 local_2c8;
  undefined6 uStack_2c6;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  GLuint textures [8];
  ios_base local_228 [272];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pVVar7 = (Vector<unsigned_int,_4> *)CONCAT44(in_register_00000034,internalformat);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)textures);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)textures,"#version 420 core\nlayout(",0x19);
  local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
  local_6c0.field_2._M_allocated_capacity = 0x6975323361626772;
  local_6c0._M_string_length = 8;
  local_6c0.field_2._M_local_buf[8] = '\0';
  local_6a0 = this;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)textures,local_6c0._M_dataplus._M_p,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") writeonly uniform ",0x14);
  local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
  local_6e0.field_2._M_allocated_capacity._0_2_ = 0x75;
  local_6e0._M_string_length = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_6e0._M_dataplus._M_p,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"image1D g_image_1d;\nlayout(",0x1b);
  _buffer = &local_688;
  local_688 = 0x6975323361626772;
  local_690 = 8;
  local_680 = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)_buffer,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") writeonly uniform ",0x14);
  local_358 = (char *)&local_348;
  local_348 = 0x75;
  local_350 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_358,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"image2D g_image_2d;\nlayout(",0x1b);
  local_378 = &local_368;
  local_368 = 0x6975323361626772;
  local_370 = 8;
  local_360 = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_378,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") writeonly uniform ",0x14);
  local_398 = (char *)&local_388;
  local_388 = 0x75;
  local_390 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_398,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"image3D g_image_3d;\nlayout(",0x1b);
  local_3b8 = &local_3a8;
  local_3a8 = 0x6975323361626772;
  local_3b0 = 8;
  local_3a0 = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_3b8,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") writeonly uniform ",0x14);
  local_3d8 = (char *)&local_3c8;
  local_3c8 = 0x75;
  local_3d0 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_3d8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"image2DRect g_image_2drect;\nlayout(",0x23);
  local_3f8 = &local_3e8;
  local_3e8 = 0x6975323361626772;
  local_3f0 = 8;
  local_3e0 = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_3f8,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") writeonly uniform ",0x14);
  local_418 = (char *)&local_408;
  local_408 = 0x75;
  local_410 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_418,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"imageCube g_image_cube;\nlayout(",0x1f)
  ;
  local_438 = &local_428;
  local_428 = 0x6975323361626772;
  local_430 = 8;
  local_420 = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_438,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") writeonly uniform ",0x14);
  local_458 = (char *)&local_448;
  local_448 = 0x75;
  local_450 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_458,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"imageBuffer g_image_buffer;\nlayout(",0x23);
  local_478 = &local_468;
  local_468 = 0x6975323361626772;
  local_470 = 8;
  local_460 = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_478,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") writeonly uniform ",0x14);
  local_498 = (char *)&local_488;
  local_488 = 0x75;
  local_490 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_498,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"image1DArray g_image_1darray;\nlayout(",0x25);
  local_4b8 = &local_4a8;
  local_4a8 = 0x6975323361626772;
  local_4b0 = 8;
  local_4a0 = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_4b8,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") writeonly uniform ",0x14);
  local_4d8 = (char *)&local_4c8;
  local_4c8 = 0x75;
  local_4d0 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_4d8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "image2DArray g_image_2darray;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_1d, coord.x, "
             ,0x76);
  local_4f8 = (char *)&local_4e8;
  local_4e8 = 0x75;
  local_4f0 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_4f8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,pVVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_2d, coord, ",0x23);
  local_518 = (char *)&local_508;
  local_508 = 0x75;
  local_510 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_518,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,pVVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_3d, ivec3(coord.xy, 0), ",0x30);
  local_538 = (char *)&local_528;
  local_528 = 0x75;
  local_530 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_538,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,pVVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_3d, ivec3(coord.xy, 1), ",0x30);
  local_558 = (char *)&local_548;
  local_548 = 0x75;
  local_550 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_558,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,pVVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_2drect, coord, ",0x27);
  local_578 = (char *)&local_568;
  local_568 = 0x75;
  local_570 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_578,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,pVVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_cube, ivec3(coord, 0), ",0x2f);
  local_598 = (char *)&local_588;
  local_588 = 0x75;
  local_590 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_598,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,pVVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_cube, ivec3(coord, 1), ",0x2f);
  local_5b8 = (char *)&local_5a8;
  local_5a8 = 0x75;
  local_5b0 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_5b8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,pVVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_cube, ivec3(coord, 2), ",0x2f);
  local_5d8 = (char *)&local_5c8;
  local_5c8 = 0x75;
  local_5d0 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_5d8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,pVVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_cube, ivec3(coord, 3), ",0x2f);
  local_5f8 = (char *)&local_5e8;
  local_5e8 = 0x75;
  local_5f0 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_5f8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,pVVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_cube, ivec3(coord, 4), ",0x2f);
  local_618 = (char *)&local_608;
  local_608 = 0x75;
  local_610 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_618,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,pVVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_cube, ivec3(coord, 5), ",0x2f);
  local_638 = (char *)&local_628;
  local_628 = 0x75;
  local_630 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_638,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,pVVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_buffer, coord.x, ",0x29);
  local_658 = (char *)&local_648;
  local_648 = 0x75;
  local_650 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_658,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,pVVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_1darray, ivec2(coord.x, 0), ",0x34);
  local_678 = (char *)&local_668;
  local_668 = 0x75;
  local_670 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_678,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,pVVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_1darray, ivec2(coord.x, 1), ",0x34);
  local_2c8 = 0x75;
  local_2d0 = 1;
  local_2d8 = (char *)&local_2c8;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_2c8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,pVVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_2darray, ivec3(coord, 0), ",0x32);
  local_2e8 = 0x75;
  local_2f0 = 1;
  local_2f8 = (char *)&local_2e8;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_2e8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,pVVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_2darray, ivec3(coord, 1), ",0x32);
  local_308 = 0x75;
  local_310 = 1;
  local_318 = (char *)&local_308;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_308,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,pVVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,");\n  discard;\n}",0xf);
  if (local_318 != (char *)&local_308) {
    operator_delete(local_318,CONCAT62(uStack_306,local_308) + 1);
  }
  this_01 = local_6a0;
  if (local_2f8 != (char *)&local_2e8) {
    operator_delete(local_2f8,CONCAT62(uStack_2e6,local_2e8) + 1);
  }
  if (local_2d8 != (char *)&local_2c8) {
    operator_delete(local_2d8,CONCAT62(uStack_2c6,local_2c8) + 1);
  }
  if (local_678 != (char *)&local_668) {
    operator_delete(local_678,CONCAT62(uStack_666,local_668) + 1);
  }
  if (local_658 != (char *)&local_648) {
    operator_delete(local_658,CONCAT62(uStack_646,local_648) + 1);
  }
  if (local_638 != (char *)&local_628) {
    operator_delete(local_638,CONCAT62(uStack_626,local_628) + 1);
  }
  if (local_618 != (char *)&local_608) {
    operator_delete(local_618,CONCAT62(uStack_606,local_608) + 1);
  }
  if (local_5f8 != (char *)&local_5e8) {
    operator_delete(local_5f8,CONCAT62(uStack_5e6,local_5e8) + 1);
  }
  if (local_5d8 != (char *)&local_5c8) {
    operator_delete(local_5d8,CONCAT62(uStack_5c6,local_5c8) + 1);
  }
  if (local_5b8 != (char *)&local_5a8) {
    operator_delete(local_5b8,CONCAT62(uStack_5a6,local_5a8) + 1);
  }
  if (local_598 != (char *)&local_588) {
    operator_delete(local_598,CONCAT62(uStack_586,local_588) + 1);
  }
  if (local_578 != (char *)&local_568) {
    operator_delete(local_578,CONCAT62(uStack_566,local_568) + 1);
  }
  if (local_558 != (char *)&local_548) {
    operator_delete(local_558,CONCAT62(uStack_546,local_548) + 1);
  }
  if (local_538 != (char *)&local_528) {
    operator_delete(local_538,CONCAT62(uStack_526,local_528) + 1);
  }
  if (local_518 != (char *)&local_508) {
    operator_delete(local_518,CONCAT62(uStack_506,local_508) + 1);
  }
  if (local_4f8 != (char *)&local_4e8) {
    operator_delete(local_4f8,CONCAT62(uStack_4e6,local_4e8) + 1);
  }
  if (local_4d8 != (char *)&local_4c8) {
    operator_delete(local_4d8,CONCAT62(uStack_4c6,local_4c8) + 1);
  }
  if (local_4b8 != &local_4a8) {
    operator_delete(local_4b8,local_4a8 + 1);
  }
  if (local_498 != (char *)&local_488) {
    operator_delete(local_498,CONCAT62(uStack_486,local_488) + 1);
  }
  if (local_478 != &local_468) {
    operator_delete(local_478,local_468 + 1);
  }
  if (local_458 != (char *)&local_448) {
    operator_delete(local_458,CONCAT62(uStack_446,local_448) + 1);
  }
  if (local_438 != &local_428) {
    operator_delete(local_438,local_428 + 1);
  }
  if (local_418 != (char *)&local_408) {
    operator_delete(local_418,CONCAT62(uStack_406,local_408) + 1);
  }
  if (local_3f8 != &local_3e8) {
    operator_delete(local_3f8,local_3e8 + 1);
  }
  if (local_3d8 != (char *)&local_3c8) {
    operator_delete(local_3d8,CONCAT62(uStack_3c6,local_3c8) + 1);
  }
  if (local_3b8 != &local_3a8) {
    operator_delete(local_3b8,local_3a8 + 1);
  }
  if (local_398 != (char *)&local_388) {
    operator_delete(local_398,CONCAT62(uStack_386,local_388) + 1);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378,local_368 + 1);
  }
  if (local_358 != (char *)&local_348) {
    operator_delete(local_358,CONCAT62(uStack_346,local_348) + 1);
  }
  if (_buffer != &local_688) {
    operator_delete(_buffer,local_688 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    operator_delete(local_6e0._M_dataplus._M_p,
                    CONCAT62(local_6e0.field_2._M_allocated_capacity._2_6_,
                             local_6e0.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
    operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)textures);
  std::ios_base::~ios_base(local_228);
  GVar2 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                    ((ShaderImageLoadStoreBase *)this_01,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_338,(bool *)0x0);
  if (local_338 != local_328) {
    operator_delete(local_338,local_328[0] + 1);
  }
  this_00 = (CallLogWrapper *)(this_01 + 8);
  glu::CallLogWrapper::glGenTextures(this_00,8,textures);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&buffer);
  __s = operator_new(0x2000);
  memset(__s,0,0x2000);
  glu::CallLogWrapper::glBindTexture(this_00,0xde0,textures[0]);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde0,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde0,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage1D(this_00,0xde0,0,0x8d70,0x10,0,0x8d99,0x1405,__s);
  glu::CallLogWrapper::glBindTexture(this_00,0xde0,0);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,textures[1]);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,__s);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x806f,textures[2]);
  glu::CallLogWrapper::glTexParameteri(this_00,0x806f,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0x806f,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage3D(this_00,0x806f,0,0x8d70,0x10,0x10,2,0,0x8d99,0x1405,__s);
  glu::CallLogWrapper::glBindTexture(this_00,0x806f,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x84f5,textures[3]);
  glu::CallLogWrapper::glTexParameteri(this_00,0x84f5,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0x84f5,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D(this_00,0x84f5,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,__s);
  glu::CallLogWrapper::glBindTexture(this_00,0x84f5,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x8513,textures[4]);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D(this_00,0x8516,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,__s);
  glu::CallLogWrapper::glTexImage2D(this_00,0x8515,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,__s);
  glu::CallLogWrapper::glTexImage2D(this_00,0x8518,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,__s);
  glu::CallLogWrapper::glTexImage2D(this_00,0x8517,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,__s);
  glu::CallLogWrapper::glTexImage2D(this_00,0x851a,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,__s);
  glu::CallLogWrapper::glTexImage2D(this_00,0x8519,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,__s);
  glu::CallLogWrapper::glBindTexture(this_00,0x8513,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,buffer);
  glu::CallLogWrapper::glBufferData(this_00,0x8c2a,0x100,__s,0x88e8);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,textures[5]);
  glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8d70,buffer);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c18,textures[6]);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c18,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c18,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D(this_00,0x8c18,0,0x8d70,0x10,2,0,0x8d99,0x1405,__s);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c18,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,textures[7]);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage3D(this_00,0x8c1a,0,0x8d70,0x10,0x10,2,0,0x8d99,0x1405,__s);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,0);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,textures[0],0,'\0',0,0x88b9,0x8d70);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,textures[1],0,'\0',0,0x88b9,0x8d70);
  glu::CallLogWrapper::glBindImageTexture(this_00,2,textures[2],0,'\x01',0,0x88b9,0x8d70);
  glu::CallLogWrapper::glBindImageTexture(this_00,3,textures[3],0,'\0',0,0x88b9,0x8d70);
  glu::CallLogWrapper::glBindImageTexture(this_00,4,textures[4],0,'\x01',0,0x88b9,0x8d70);
  glu::CallLogWrapper::glBindImageTexture(this_00,5,textures[5],0,'\0',0,0x88b9,0x8d70);
  glu::CallLogWrapper::glBindImageTexture(this_00,6,textures[6],0,'\x01',0,0x88b9,0x8d70);
  glu::CallLogWrapper::glBindImageTexture(this_00,7,textures[7],0,'\x01',0,0x88b9,0x8d70);
  glu::CallLogWrapper::glUseProgram(this_00,GVar2);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar2,"g_image_1d");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,0);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar2,"g_image_2d");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,1);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar2,"g_image_3d");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,2);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar2,"g_image_2drect");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,3);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar2,"g_image_cube");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,4);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar2,"g_image_buffer");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,5);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar2,"g_image_1darray");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,6);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar2,"g_image_2darray");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,7);
  glu::CallLogWrapper::glBindVertexArray(this_00,*(GLuint *)(this_01 + 0x28));
  glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  glu::CallLogWrapper::glBindTexture(this_00,0xde0,textures[0]);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  glu::CallLogWrapper::glGetTexImage(this_00,0xde0,0,0x8d99,0x1405,__s);
  glu::CallLogWrapper::glBindTexture(this_00,0xde0,0);
  lVar5 = 0;
  pvVar6 = __s;
  do {
    pVVar7 = (Vector<unsigned_int,_4> *)(lVar5 * 0x10 + (long)__s);
    bVar10 = true;
    lVar9 = 0;
    do {
      if (bVar10) {
        bVar10 = *(uint *)((long)pvVar6 + lVar9 * 4) == write_value->m_data[lVar9];
      }
      else {
        bVar10 = false;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    if (!bVar10) {
      local_48 = *(undefined8 *)pVVar7->m_data;
      uStack_40 = *(undefined8 *)(pVVar7->m_data + 2);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>(&local_6c0,&local_48,pVVar7);
      _Var1._M_p = local_6c0._M_dataplus._M_p;
      local_58 = *(undefined8 *)write_value->m_data;
      uStack_50 = *(undefined8 *)(write_value->m_data + 2);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>(&local_6e0,&local_58,v);
      gl4cts::anon_unknown_0::Output
                ("GL_TEXTURE_1D target failed. Value is: %s. Value should be: %s.\n",_Var1._M_p,
                 local_6e0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
        operator_delete(local_6e0._M_dataplus._M_p,
                        CONCAT62(local_6e0.field_2._M_allocated_capacity._2_6_,
                                 local_6e0.field_2._M_allocated_capacity._0_2_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
        operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
      }
      bVar10 = false;
      goto LAB_009b84fa;
    }
    lVar5 = lVar5 + 1;
    pvVar6 = (void *)((long)pvVar6 + 0x10);
  } while (lVar5 != 0x10);
  bVar10 = true;
LAB_009b84fa:
  lVar5 = 0;
  do {
    *(undefined8 *)((long)__s + lVar5) = 0;
    ((undefined8 *)((long)__s + lVar5))[1] = 0;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x2000);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,textures[1]);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  glu::CallLogWrapper::glGetTexImage(this_00,0xde1,0,0x8d99,0x1405,__s);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  lVar5 = 0;
  pvVar6 = __s;
  do {
    pVVar7 = (Vector<unsigned_int,_4> *)(lVar5 * 0x10 + (long)__s);
    bVar11 = true;
    lVar9 = 0;
    do {
      if (bVar11) {
        bVar11 = *(uint *)((long)pvVar6 + lVar9 * 4) == write_value->m_data[lVar9];
      }
      else {
        bVar11 = false;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    if (!bVar11) {
      local_68 = *(undefined8 *)pVVar7->m_data;
      uStack_60 = *(undefined8 *)(pVVar7->m_data + 2);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>(&local_6c0,&local_68,pVVar7);
      _Var1._M_p = local_6c0._M_dataplus._M_p;
      local_78 = *(undefined8 *)write_value->m_data;
      uStack_70 = *(undefined8 *)(write_value->m_data + 2);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>(&local_6e0,&local_78,v_00);
      gl4cts::anon_unknown_0::Output
                ("GL_TEXTURE_2D target failed. Value is: %s. Value should be: %s.\n",_Var1._M_p,
                 local_6e0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
        operator_delete(local_6e0._M_dataplus._M_p,
                        CONCAT62(local_6e0.field_2._M_allocated_capacity._2_6_,
                                 local_6e0.field_2._M_allocated_capacity._0_2_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
        operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
      }
      bVar10 = false;
      break;
    }
    lVar5 = lVar5 + 1;
    pvVar6 = (void *)((long)pvVar6 + 0x10);
  } while (lVar5 != 0x100);
  glu::CallLogWrapper::glBindTexture(this_00,0x806f,textures[2]);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  glu::CallLogWrapper::glGetTexImage(this_00,0x806f,0,0x8d99,0x1405,__s);
  glu::CallLogWrapper::glBindTexture(this_00,0x806f,0);
  lVar5 = 0;
  pvVar6 = __s;
  do {
    pVVar7 = (Vector<unsigned_int,_4> *)(lVar5 * 0x10 + (long)__s);
    bVar11 = true;
    lVar9 = 0;
    do {
      if (bVar11) {
        bVar11 = *(uint *)((long)pvVar6 + lVar9 * 4) == write_value->m_data[lVar9];
      }
      else {
        bVar11 = false;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    if (!bVar11) {
      local_88 = *(undefined8 *)pVVar7->m_data;
      uStack_80 = *(undefined8 *)(pVVar7->m_data + 2);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>(&local_6c0,&local_88,pVVar7);
      _Var1._M_p = local_6c0._M_dataplus._M_p;
      local_98 = *(undefined8 *)write_value->m_data;
      uStack_90 = *(undefined8 *)(write_value->m_data + 2);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>(&local_6e0,&local_98,v_01);
      gl4cts::anon_unknown_0::Output
                ("GL_TEXTURE_3D target failed. Value is: %s. Value should be: %s.\n",_Var1._M_p,
                 local_6e0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
        operator_delete(local_6e0._M_dataplus._M_p,
                        CONCAT62(local_6e0.field_2._M_allocated_capacity._2_6_,
                                 local_6e0.field_2._M_allocated_capacity._0_2_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
        operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
      }
      bVar10 = false;
      break;
    }
    lVar5 = lVar5 + 1;
    pvVar6 = (void *)((long)pvVar6 + 0x10);
  } while (lVar5 != 0x200);
  glu::CallLogWrapper::glBindTexture(this_00,0x84f5,textures[3]);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  glu::CallLogWrapper::glGetTexImage(this_00,0x84f5,0,0x8d99,0x1405,__s);
  glu::CallLogWrapper::glBindTexture(this_00,0x84f5,0);
  lVar5 = 0;
  pvVar6 = __s;
  do {
    pVVar7 = (Vector<unsigned_int,_4> *)(lVar5 * 0x10 + (long)__s);
    bVar11 = true;
    lVar9 = 0;
    do {
      if (bVar11) {
        bVar11 = *(uint *)((long)pvVar6 + lVar9 * 4) == write_value->m_data[lVar9];
      }
      else {
        bVar11 = false;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    if (!bVar11) {
      local_a8 = *(undefined8 *)pVVar7->m_data;
      uStack_a0 = *(undefined8 *)(pVVar7->m_data + 2);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>(&local_6c0,&local_a8,pVVar7);
      _Var1._M_p = local_6c0._M_dataplus._M_p;
      local_b8 = *(undefined8 *)write_value->m_data;
      uStack_b0 = *(undefined8 *)(write_value->m_data + 2);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>(&local_6e0,&local_b8,v_02);
      gl4cts::anon_unknown_0::Output
                ("GL_TEXTURE_RECTANGLE target failed. Value is: %s. Value should be: %s.\n",
                 _Var1._M_p,local_6e0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
        operator_delete(local_6e0._M_dataplus._M_p,
                        CONCAT62(local_6e0.field_2._M_allocated_capacity._2_6_,
                                 local_6e0.field_2._M_allocated_capacity._0_2_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
        operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
      }
      bVar10 = false;
      break;
    }
    lVar5 = lVar5 + 1;
    pvVar6 = (void *)((long)pvVar6 + 0x10);
  } while (lVar5 != 0x100);
  glu::CallLogWrapper::glBindTexture(this_00,0x8513,textures[4]);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  local_6a0 = (BasicAllTargetsStore *)CONCAT44(local_6a0._4_4_,GVar2);
  uVar8 = 0;
  do {
    glu::CallLogWrapper::glGetTexImage(this_00,uVar8 + 0x8515,0,0x8d99,0x1405,__s);
    lVar5 = 0;
    pvVar6 = __s;
    do {
      pVVar7 = (Vector<unsigned_int,_4> *)(lVar5 * 0x10 + (long)__s);
      bVar11 = true;
      lVar9 = 0;
      do {
        if (bVar11) {
          bVar11 = *(uint *)((long)pvVar6 + lVar9 * 4) == write_value->m_data[lVar9];
        }
        else {
          bVar11 = false;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      if (!bVar11) {
        local_2a8 = *(undefined8 *)pVVar7->m_data;
        uStack_2a0 = *(undefined8 *)(pVVar7->m_data + 2);
        ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
                  (&local_6c0,&local_2a8,pVVar7);
        _Var1._M_p = local_6c0._M_dataplus._M_p;
        local_2b8 = *(undefined8 *)write_value->m_data;
        uStack_2b0 = *(undefined8 *)(write_value->m_data + 2);
        ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>(&local_6e0,&local_2b8,v_03);
        gl4cts::anon_unknown_0::Output
                  ("GL_TEXTURE_CUBE_MAP_POSITIVE_X + %d target failed. Value is: %s. Value should be: %s.\n"
                   ,(ulong)uVar8,_Var1._M_p,local_6e0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
          operator_delete(local_6e0._M_dataplus._M_p,
                          CONCAT62(local_6e0.field_2._M_allocated_capacity._2_6_,
                                   local_6e0.field_2._M_allocated_capacity._0_2_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
          operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
        }
        bVar10 = false;
        break;
      }
      lVar5 = lVar5 + 1;
      pvVar6 = (void *)((long)pvVar6 + 0x10);
    } while (lVar5 != 0x100);
    uVar8 = uVar8 + 1;
  } while (uVar8 != 6);
  glu::CallLogWrapper::glBindTexture(this_00,0x8513,0);
  GVar2 = (GLuint)local_6a0;
  glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,textures[5]);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,buffer);
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c2a,0,0x100,__s);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
  lVar5 = 0;
  pvVar6 = __s;
  do {
    pVVar7 = (Vector<unsigned_int,_4> *)(lVar5 * 0x10 + (long)__s);
    bVar11 = true;
    lVar9 = 0;
    do {
      if (bVar11) {
        bVar11 = *(uint *)((long)pvVar6 + lVar9 * 4) == write_value->m_data[lVar9];
      }
      else {
        bVar11 = false;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    if (!bVar11) {
      local_c8 = *(undefined8 *)pVVar7->m_data;
      uStack_c0 = *(undefined8 *)(pVVar7->m_data + 2);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>(&local_6c0,&local_c8,pVVar7);
      _Var1._M_p = local_6c0._M_dataplus._M_p;
      local_d8 = *(undefined8 *)write_value->m_data;
      uStack_d0 = *(undefined8 *)(write_value->m_data + 2);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>(&local_6e0,&local_d8,v_04);
      gl4cts::anon_unknown_0::Output
                ("GL_TEXTURE_BUFFER target failed. Value is: %s. Value should be: %s.\n",_Var1._M_p,
                 local_6e0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
        operator_delete(local_6e0._M_dataplus._M_p,
                        CONCAT62(local_6e0.field_2._M_allocated_capacity._2_6_,
                                 local_6e0.field_2._M_allocated_capacity._0_2_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
        operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
      }
      bVar10 = false;
      break;
    }
    lVar5 = lVar5 + 1;
    pvVar6 = (void *)((long)pvVar6 + 0x10);
  } while (lVar5 != 0x10);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c18,textures[6]);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  glu::CallLogWrapper::glGetTexImage(this_00,0x8c18,0,0x8d99,0x1405,__s);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c18,0);
  lVar5 = 0;
  pvVar6 = __s;
  do {
    pVVar7 = (Vector<unsigned_int,_4> *)(lVar5 * 0x10 + (long)__s);
    bVar11 = true;
    lVar9 = 0;
    do {
      if (bVar11) {
        bVar11 = *(uint *)((long)pvVar6 + lVar9 * 4) == write_value->m_data[lVar9];
      }
      else {
        bVar11 = false;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    if (!bVar11) {
      local_e8 = *(undefined8 *)pVVar7->m_data;
      uStack_e0 = *(undefined8 *)(pVVar7->m_data + 2);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>(&local_6c0,&local_e8,pVVar7);
      _Var1._M_p = local_6c0._M_dataplus._M_p;
      local_f8 = *(undefined8 *)write_value->m_data;
      uStack_f0 = *(undefined8 *)(write_value->m_data + 2);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>(&local_6e0,&local_f8,v_05);
      gl4cts::anon_unknown_0::Output
                ("GL_TEXTURE_1D_ARRAY target failed. Value is: %s. Value should be: %s.\n",
                 _Var1._M_p,local_6e0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
        operator_delete(local_6e0._M_dataplus._M_p,
                        CONCAT62(local_6e0.field_2._M_allocated_capacity._2_6_,
                                 local_6e0.field_2._M_allocated_capacity._0_2_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
        operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
      }
      bVar10 = false;
      break;
    }
    lVar5 = lVar5 + 1;
    pvVar6 = (void *)((long)pvVar6 + 0x10);
  } while (lVar5 != 0x20);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,textures[7]);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  glu::CallLogWrapper::glGetTexImage(this_00,0x8c1a,0,0x8d99,0x1405,__s);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,0);
  lVar5 = 0;
  pvVar6 = __s;
  while( true ) {
    pVVar7 = (Vector<unsigned_int,_4> *)(lVar5 * 0x10 + (long)__s);
    bVar11 = true;
    lVar9 = 0;
    do {
      if (bVar11) {
        bVar11 = *(uint *)((long)pvVar6 + lVar9 * 4) == write_value->m_data[lVar9];
      }
      else {
        bVar11 = false;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    if (!bVar11) break;
    lVar5 = lVar5 + 1;
    pvVar6 = (void *)((long)pvVar6 + 0x10);
    if (lVar5 == 0x200) {
LAB_009b8d27:
      glu::CallLogWrapper::glUseProgram(this_00,0);
      glu::CallLogWrapper::glDeleteProgram(this_00,GVar2);
      glu::CallLogWrapper::glDeleteTextures(this_00,8,textures);
      glu::CallLogWrapper::glDeleteBuffers(this_00,1,&buffer);
      operator_delete(__s,0x2000);
      return bVar10;
    }
  }
  local_108 = *(undefined8 *)pVVar7->m_data;
  uStack_100 = *(undefined8 *)(pVVar7->m_data + 2);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>(&local_6c0,&local_108,pVVar7);
  _Var1._M_p = local_6c0._M_dataplus._M_p;
  local_118 = *(undefined8 *)write_value->m_data;
  uStack_110 = *(undefined8 *)(write_value->m_data + 2);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>(&local_6e0,&local_118,v_06);
  gl4cts::anon_unknown_0::Output
            ("GL_TEXTURE_2D_ARRAY target failed. Value is: %s. Value should be: %s.\n",_Var1._M_p,
             local_6e0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    operator_delete(local_6e0._M_dataplus._M_p,
                    CONCAT62(local_6e0.field_2._M_allocated_capacity._2_6_,
                             local_6e0.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
    operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
  }
  bVar10 = false;
  goto LAB_009b8d27;
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		const GLuint program = BuildProgram(src_vs, NULL, NULL, NULL, GenFS(internalformat, write_value).c_str());
		GLuint		 textures[8];
		GLuint		 buffer;
		glGenTextures(8, textures);
		glGenBuffers(1, &buffer);

		const int	  kSize = 16;
		std::vector<T> data(kSize * kSize * 2);

		glBindTexture(GL_TEXTURE_1D, textures[0]);
		glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage1D(GL_TEXTURE_1D, 0, internalformat, kSize, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_1D, 0);

		glBindTexture(GL_TEXTURE_2D, textures[1]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_2D, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_2D, 0);

		glBindTexture(GL_TEXTURE_3D, textures[2]);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_3D, 0, internalformat, kSize, kSize, 2, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_3D, 0);

		glBindTexture(GL_TEXTURE_RECTANGLE, textures[3]);
		glTexParameteri(GL_TEXTURE_RECTANGLE, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_RECTANGLE, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_RECTANGLE, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_RECTANGLE, 0);

		glBindTexture(GL_TEXTURE_CUBE_MAP, textures[4]);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glBindTexture(GL_TEXTURE_CUBE_MAP, 0);

		glBindBuffer(GL_TEXTURE_BUFFER, buffer);
		glBufferData(GL_TEXTURE_BUFFER, kSize * sizeof(T), &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_TEXTURE_BUFFER, 0);
		glBindTexture(GL_TEXTURE_BUFFER, textures[5]);
		glTexBuffer(GL_TEXTURE_BUFFER, internalformat, buffer);
		glBindTexture(GL_TEXTURE_BUFFER, 0);

		glBindTexture(GL_TEXTURE_1D_ARRAY, textures[6]);
		glTexParameteri(GL_TEXTURE_1D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_1D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_1D_ARRAY, 0, internalformat, kSize, 2, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_1D_ARRAY, 0);

		glBindTexture(GL_TEXTURE_2D_ARRAY, textures[7]);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, internalformat, kSize, kSize, 2, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);

		glBindImageTexture(0, textures[0], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(1, textures[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(2, textures[2], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(3, textures[3], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(4, textures[4], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(5, textures[5], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(6, textures[6], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(7, textures[7], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);

		glUseProgram(program);
		glUniform1i(glGetUniformLocation(program, "g_image_1d"), 0);
		glUniform1i(glGetUniformLocation(program, "g_image_2d"), 1);
		glUniform1i(glGetUniformLocation(program, "g_image_3d"), 2);
		glUniform1i(glGetUniformLocation(program, "g_image_2drect"), 3);
		glUniform1i(glGetUniformLocation(program, "g_image_cube"), 4);
		glUniform1i(glGetUniformLocation(program, "g_image_buffer"), 5);
		glUniform1i(glGetUniformLocation(program, "g_image_1darray"), 6);
		glUniform1i(glGetUniformLocation(program, "g_image_2darray"), 7);

		glBindVertexArray(m_vao);
		glViewport(0, 0, kSize, kSize);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		bool status = true;

		glBindTexture(GL_TEXTURE_1D, textures[0]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_1D, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_1D, 0);
		for (int i = 0; i < kSize; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_1D target failed. Value is: %s. Value should be: %s.\n", ToString(data[i]).c_str(),
					   ToString(expected_value).c_str());
				break;
			}
		}
		std::fill(data.begin(), data.end(), T(0));

		glBindTexture(GL_TEXTURE_2D, textures[1]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_2D, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_2D, 0);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_2D target failed. Value is: %s. Value should be: %s.\n", ToString(data[i]).c_str(),
					   ToString(expected_value).c_str());
				break;
			}
		}

		glBindTexture(GL_TEXTURE_3D, textures[2]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_3D, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_3D, 0);
		for (int i = 0; i < kSize * kSize * 2; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_3D target failed. Value is: %s. Value should be: %s.\n", ToString(data[i]).c_str(),
					   ToString(expected_value).c_str());
				break;
			}
		}

		glBindTexture(GL_TEXTURE_RECTANGLE, textures[3]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_RECTANGLE, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_RECTANGLE, 0);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_RECTANGLE target failed. Value is: %s. Value should be: %s.\n",
					   ToString(data[i]).c_str(), ToString(expected_value).c_str());
				break;
			}
		}

		{
			glBindTexture(GL_TEXTURE_CUBE_MAP, textures[4]);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			for (int face = 0; face < 6; ++face)
			{
				glGetTexImage(GL_TEXTURE_CUBE_MAP_POSITIVE_X + face, 0, Format<T>(), Type<T>(), &data[0]);
				for (int i = 0; i < kSize * kSize; ++i)
				{
					if (!tcu::allEqual(data[i], expected_value))
					{
						status = false;
						Output(
							"GL_TEXTURE_CUBE_MAP_POSITIVE_X + %d target failed. Value is: %s. Value should be: %s.\n",
							face, ToString(data[i]).c_str(), ToString(expected_value).c_str());
						break;
					}
				}
			}
			glBindTexture(GL_TEXTURE_CUBE_MAP, 0);
		}

		glBindTexture(GL_TEXTURE_BUFFER, textures[5]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glBindTexture(GL_TEXTURE_BUFFER, 0);
		glBindBuffer(GL_TEXTURE_BUFFER, buffer);
		glGetBufferSubData(GL_TEXTURE_BUFFER, 0, kSize * sizeof(T), &data[0]);
		glBindBuffer(GL_TEXTURE_BUFFER, 0);
		for (int i = 0; i < kSize; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_BUFFER target failed. Value is: %s. Value should be: %s.\n",
					   ToString(data[i]).c_str(), ToString(expected_value).c_str());
				break;
			}
		}

		glBindTexture(GL_TEXTURE_1D_ARRAY, textures[6]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_1D_ARRAY, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_1D_ARRAY, 0);
		for (int i = 0; i < kSize * 2; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_1D_ARRAY target failed. Value is: %s. Value should be: %s.\n",
					   ToString(data[i]).c_str(), ToString(expected_value).c_str());
				break;
			}
		}

		glBindTexture(GL_TEXTURE_2D_ARRAY, textures[7]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_2D_ARRAY, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);
		for (int i = 0; i < kSize * kSize * 2; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_2D_ARRAY target failed. Value is: %s. Value should be: %s.\n",
					   ToString(data[i]).c_str(), ToString(expected_value).c_str());
				break;
			}
		}

		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteTextures(8, textures);
		glDeleteBuffers(1, &buffer);

		return status;
	}